

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O2

void __thiscall
google::protobuf::internal::ArenaStringPtr::CreateInstance
          (ArenaStringPtr *this,Arena *arena,string *initial_value)

{
  LogMessage *other;
  string *this_00;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (initial_value == (string *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/arenastring.h"
               ,0x172);
    other = LogMessage::operator<<(&local_58,"CHECK failed: initial_value != NULL: ");
    LogFinisher::operator=(&local_59,other);
    LogMessage::~LogMessage(&local_58);
  }
  if (arena == (Arena *)0x0) {
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)this_00,(string *)initial_value);
  }
  else {
    Arena::AllocHook(arena,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    this_00 = (string *)
              ArenaImpl::AllocateAlignedAndAddCleanup
                        (&arena->impl_,0x20,arena_destruct_object<std::__cxx11::string>);
    std::__cxx11::string::string((string *)this_00,(string *)initial_value);
  }
  this->ptr_ = this_00;
  return;
}

Assistant:

PROTOBUF_NOINLINE
  void CreateInstance(Arena* arena, const ::std::string* initial_value) {
    GOOGLE_DCHECK(initial_value != NULL);
    // uses "new ::std::string" when arena is nullptr
    ptr_ = Arena::Create< ::std::string>(arena, *initial_value);
  }